

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolj.c
# Opt level: O0

int ffgpvj(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,long nulval,long *array,
          int *anynul,int *status)

{
  int iVar1;
  LONGLONG local_70;
  long *local_68;
  long nullvalue;
  int nullcheck;
  char cdummy;
  long row;
  long *array_local;
  long nulval_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  long group_local;
  fitsfile *fptr_local;
  
  nullvalue._0_4_ = 1;
  row = (long)array;
  array_local = (long *)nulval;
  nulval_local = nelem;
  nelem_local = firstelem;
  firstelem_local = group;
  group_local = (long)fptr;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    if (firstelem_local < 1) {
      local_70 = 1;
    }
    else {
      local_70 = firstelem_local;
    }
    _nullcheck = local_70;
    ffgclj((fitsfile *)group_local,2,local_70,nelem_local,nulval_local,1,1,(long)array_local,
           (long *)row,(char *)((long)&nullvalue + 7),anynul,status);
    fptr_local._4_4_ = *status;
  }
  else {
    local_68 = array_local;
    fits_read_compressed_pixels
              ((fitsfile *)group_local,0x29,nelem_local,nulval_local,(int)nullvalue,&local_68,
               (void *)row,(char *)0x0,anynul,status);
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgpvj( fitsfile *fptr,   /* I - FITS file pointer                       */
            long  group,      /* I - group to read (1 = 1st group)           */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            long  nulval,     /* I - value for undefined pixels              */
            long  *array,     /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    long row;
    char cdummy;
    int nullcheck = 1;
    long nullvalue;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */
         nullvalue = nulval;  /* set local variable */

        fits_read_compressed_pixels(fptr, TLONG, firstelem, nelem,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffgclj(fptr, 2, row, firstelem, nelem, 1, 1, nulval,
               array, &cdummy, anynul, status);
    return(*status);
}